

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O3

BitStream * bsOpenReadStream(FILE *stream)

{
  BitStream *pBVar1;
  Int32 n;
  
  n = 0x18;
  pBVar1 = (BitStream *)malloc(0x18);
  if (pBVar1 != (BitStream *)0x0) {
    pBVar1->handle = stream;
    pBVar1->buffer = 0;
    pBVar1->buffLive = 0;
    pBVar1->mode = 'r';
    return pBVar1;
  }
  mallocFail(n);
}

Assistant:

static BitStream* bsOpenReadStream ( FILE* stream )
{
   BitStream *bs = malloc ( sizeof(BitStream) );
   if (bs == NULL) mallocFail ( sizeof(BitStream) );
   bs->handle = stream;
   bs->buffer = 0;
   bs->buffLive = 0;
   bs->mode = 'r';
   return bs;
}